

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O0

int Cba_FonLeft(Cba_Ntk_t *p,int f)

{
  int iVar1;
  int f_local;
  Cba_Ntk_t *p_local;
  
  iVar1 = Cba_FonRange(p,f);
  iVar1 = Cba_NtkRangeLeft(p,iVar1);
  return iVar1;
}

Assistant:

static inline int            Cba_FonLeft( Cba_Ntk_t * p, int f )             { return Cba_NtkRangeLeft(p, Cba_FonRange(p, f));                                             }